

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::clear_ReplaceValue(Imputer *this)

{
  if (this->_oneof_case_[1] == 0xd) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->ReplaceValue_).replacestringvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void Imputer::clear_ReplaceValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      // No need to clear
      break;
    }
    case kReplaceInt64Value: {
      // No need to clear
      break;
    }
    case kReplaceStringValue: {
      ReplaceValue_.replacestringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = REPLACEVALUE_NOT_SET;
}